

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O3

int llmsset_rehash_bucket(llmsset_t dbs,uint64_t d_idx)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  int iVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar4 = 0xcbf29ce484222325;
  uVar8 = *(uint64_t *)(dbs->data + d_idx * 0x10);
  uVar5 = *(uint64_t *)(dbs->data + d_idx * 0x10 + 8);
  if ((long)(dbs->bitmapc[d_idx >> 6] << (d_idx & 0x3f)) < 0) {
    uVar4 = (*dbs->hash_cb)(uVar8,uVar5,0xcbf29ce484222325);
  }
  else {
    lVar2 = 0;
    do {
      uVar9 = uVar8 & 0xff;
      uVar8 = uVar8 >> 8;
      uVar4 = uVar4 ^ *(ulong *)((long)sylvan_tabhash_table + lVar2 + uVar9 * 8);
      lVar2 = lVar2 + 0x800;
    } while ((int)lVar2 != 0x4000);
    lVar2 = 0;
    do {
      uVar9 = uVar5 & 0xff;
      uVar5 = uVar5 >> 8;
      uVar4 = uVar4 ^ *(ulong *)(lVar2 + uVar9 * 8 + 0x13e350);
      lVar2 = lVar2 + 0x800;
    } while ((int)lVar2 != 0x4000);
  }
  uVar3 = uVar4 >> 0x11;
  iVar7 = 0;
  uVar6 = uVar4 & 0xffffff0000000000;
  uVar10 = dbs->mask & uVar4;
  uVar9 = uVar10;
  do {
    if (dbs->table[uVar10] == 0) {
      puVar1 = dbs->table + uVar10;
      LOCK();
      bVar11 = *puVar1 == 0;
      if (bVar11) {
        *puVar1 = uVar6 | d_idx;
      }
      UNLOCK();
      if (bVar11) {
        return 1;
      }
    }
    uVar10 = (ulong)((int)uVar10 + 1U & 7) | uVar10 & 0xfffffffffffffff8;
    if (uVar10 == uVar9) {
      iVar7 = iVar7 + 1;
      if (iVar7 == dbs->threshold) {
        LOCK();
        dbs->threshold = dbs->threshold + 1;
        UNLOCK();
      }
      uVar4 = uVar4 + (uVar3 & 0xfffffffffffffff0 | 8);
      uVar10 = dbs->mask & uVar4;
      uVar9 = uVar10;
    }
  } while( true );
}

Assistant:

int
llmsset_rehash_bucket(const llmsset_t dbs, uint64_t d_idx)
{
    const uint64_t * const d_ptr = ((uint64_t*)dbs->data) + 2*d_idx;
    const uint64_t a = d_ptr[0];
    const uint64_t b = d_ptr[1];

    uint64_t hash_rehash = 14695981039346656037LLU;
    const int custom = is_custom_bucket(dbs, d_idx) ? 1 : 0;
    if (custom) hash_rehash = dbs->hash_cb(a, b, hash_rehash);
    else hash_rehash = sylvan_tabhash16(a, b, hash_rehash);
    const uint64_t step = (((hash_rehash >> 20) | 1) << 3);
    const uint64_t new_v = (hash_rehash & MASK_HASH) | d_idx;
    int i=0;

    uint64_t idx, last;
#if LLMSSET_MASK
    last = idx = hash_rehash & dbs->mask;
#else
    last = idx = hash_rehash % dbs->table_size;
#endif

    for (;;) {
        _Atomic(uint64_t)* bucket = &dbs->table[idx];
        uint64_t v = atomic_load_explicit(bucket, memory_order_acquire);
        if (v == 0 && atomic_compare_exchange_strong(bucket, &v, new_v)) return 1;

        // find next idx on probe sequence
        idx = (idx & CL_MASK) | ((idx+1) & CL_MASK_R);
        if (idx == last) {
            if (++i == atomic_load_explicit(&dbs->threshold, memory_order_relaxed)) {
                // failed to find empty spot in probe sequence
                // solution: increase probe sequence length...
                atomic_fetch_add(&dbs->threshold, 1);
            }

            // go to next cache line in probe sequence
            hash_rehash += step;

#if LLMSSET_MASK
            last = idx = hash_rehash & dbs->mask;
#else
            last = idx = hash_rehash % dbs->table_size;
#endif
        }
    }
}